

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O3

int dwarf_get_loclist_offset_index_value
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned offsetentry_index,
              Dwarf_Unsigned *offset_value_out,Dwarf_Unsigned *global_offset_value_out,
              Dwarf_Error *error)

{
  Dwarf_Loclists_Context pDVar1;
  Dwarf_Unsigned in_RAX;
  ulong uVar2;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned local_28;
  
  local_28 = in_RAX;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_offset_index_value()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (dbg->de_loclists_context_count <= context_index) {
      return -1;
    }
    pDVar1 = dbg->de_loclists_context[context_index];
    if ((pDVar1 == (Dwarf_Loclists_Context)0x0) || (pDVar1->lc_magic != 0xadab4)) {
      msg = 
      "DW_DLE_DBG_NULLcontext NULL or not LOCLISTS_MAGIC found in dwarf_get_loclist_offset_index_value()"
      ;
      errval = 0x51;
    }
    else {
      if (pDVar1->lc_offset_entry_count <= offsetentry_index) {
        return -1;
      }
      uVar2 = (ulong)pDVar1->lc_offset_size;
      local_28 = 0;
      if (pDVar1->lc_offsets_array + offsetentry_index * uVar2 + uVar2 <= pDVar1->lc_endaddr) {
        (*dbg->de_copy_word)(&local_28,pDVar1->lc_offsets_array + offsetentry_index * uVar2,uVar2);
        if (offset_value_out != (Dwarf_Unsigned *)0x0) {
          *offset_value_out = local_28;
        }
        if (global_offset_value_out == (Dwarf_Unsigned *)0x0) {
          return 0;
        }
        *global_offset_value_out = local_28 + pDVar1->lc_offsets_off_in_sect;
        return 0;
      }
      msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      errval = 0x14b;
    }
  }
  _dwarf_error_string(dbg,error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_get_loclist_offset_index_value(Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned offsetentry_index,
    Dwarf_Unsigned * offset_value_out,
    Dwarf_Unsigned * global_offset_value_out,
    Dwarf_Error *error)
{
    Dwarf_Loclists_Context con = 0;
    unsigned offset_len = 0;
    Dwarf_Small *offsetptr = 0;
    Dwarf_Unsigned targetoffset = 0;

    CHECK_DBG(dbg,error,"dwarf_get_loclist_offset_index_value()");
    if (!dbg->de_loclists_context_count) {
    }
    if (context_index >= dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_loclists_context[context_index];
    if (!con || con->lc_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(dbg, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "context NULL or not LOCLISTS_MAGIC "
            "found in "
            "dwarf_get_loclist_offset_index_value()");
        return DW_DLV_ERROR;
    }

    if (offsetentry_index >= con->lc_offset_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    offset_len = con->lc_offset_size;
    offsetptr = con->lc_offsets_array +
        (offsetentry_index*offset_len);
    READ_UNALIGNED_CK(dbg,targetoffset,Dwarf_Unsigned,
        offsetptr,
        offset_len,error,con->lc_endaddr);
    if (offset_value_out) {
        *offset_value_out = targetoffset;
    }
    if (global_offset_value_out) {
        *global_offset_value_out = targetoffset +
            con->lc_offsets_off_in_sect;
    }
    return DW_DLV_OK;
}